

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SourceLineInfo::~SourceLineInfo(SourceLineInfo *this)

{
  SourceLineInfo *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SourceLineInfo( const std::string& _file, std::size_t _line )
        :   file( _file ),
            line( _line )
        {}